

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ay_Cpu.cpp
# Opt level: O0

void __thiscall Ay_Cpu::reset(Ay_Cpu *this,void *m)

{
  undefined8 in_RSI;
  long in_RDI;
  
  *(undefined8 *)(in_RDI + 0x200) = in_RSI;
  *(long *)(in_RDI + 0x210) = in_RDI + 0x218;
  *(undefined4 *)(in_RDI + 0x21c) = 0;
  *(undefined4 *)(in_RDI + 0x218) = 0;
  *(undefined4 *)(in_RDI + 0x208) = 0;
  memset((void *)(in_RDI + 0x220),0,0x1e);
  return;
}

Assistant:

void Ay_Cpu::reset( void* m )
{
	mem = (uint8_t*) m;
	
	check( state == &state_ );
	state = &state_;
	state_.time = 0;
	state_.base = 0;
	end_time_   = 0;
	
	memset( &r, 0, sizeof r );
}